

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O0

int SetMaxAngleIM483I(IM483I *pIM483I,double angle)

{
  int iVar1;
  int local_30;
  int local_2c;
  int local_28;
  int val;
  double angle_local;
  IM483I *pIM483I_local;
  
  local_2c = (int)((angle * 116000.0) / (pIM483I->MaxAngle - pIM483I->MinAngle));
  local_28 = local_2c;
  if (0x1c51f < local_2c) {
    local_28 = 0x1c520;
  }
  if (local_28 < 1) {
    local_30 = 0;
  }
  else {
    if (0x1c51f < local_2c) {
      local_2c = 0x1c520;
    }
    local_30 = local_2c;
  }
  iVar1 = SetMotorRelativeIM483I(pIM483I,-local_30,(uint)(angle == 0.0));
  pIM483I_local._4_4_ = (uint)(iVar1 != 0);
  return pIM483I_local._4_4_;
}

Assistant:

inline int SetMaxAngleIM483I(IM483I* pIM483I, double angle)
{
	int val = 0;

	// Convert angle (in rad) into value for the motor.
	val = (int)(angle*(MAX_IM483I-MIN_IM483I)/(pIM483I->MaxAngle-pIM483I->MinAngle));

	val = max(min(val, MAX_IM483I), MIN_IM483I);

	if (SetMotorRelativeIM483I(pIM483I, -val, (angle == 0.0)? TRUE: FALSE) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}